

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QVariant * __thiscall
QFileSystemModel::data
          (QVariant *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index,int role)

{
  int iVar1;
  long lVar2;
  QFileSystemModelPrivate *this_00;
  bool bVar3;
  Permissions PVar4;
  QAbstractFileIconProvider *pQVar5;
  QFileSystemNode *this_01;
  long in_FS_OFFSET;
  QIcon QStack_58;
  QIcon icon;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  bVar3 = QModelIndex::isValid(index);
  if ((!bVar3) || ((index->m).ptr != &this->super_QAbstractItemModel))
  goto switchD_0056ed98_caseD_fd;
  switch(role) {
  case 0:
    iVar1 = index->c;
LAB_0056ee15:
    switch(iVar1) {
    case 0:
      goto switchD_0056ed98_caseD_102;
    case 1:
      QFileSystemModelPrivate::size((QString *)&icon,this_00,index);
      break;
    case 2:
      QFileSystemModelPrivate::type((QString *)&icon,this_00,index);
      break;
    case 3:
      QFileSystemModelPrivate::time((QFileSystemModelPrivate *)&icon,(time_t *)this_00);
      break;
    default:
      icon.d._0_4_ = 2;
      icon.d._4_4_ = 0;
      QMessageLogger::warning((char *)&icon,"data: invalid display value column %d");
      goto switchD_0056ed98_caseD_fd;
    }
    break;
  case 1:
    if (index->c != 0) goto switchD_0056ed98_caseD_fd;
    icon.d._0_4_ = 0xaaaaaaaa;
    icon.d._4_4_ = 0xaaaaaaaa;
    QFileSystemModelPrivate::icon((QFileSystemModelPrivate *)&icon,(QModelIndex *)this_00);
    bVar3 = QIcon::isNull(&icon);
    if ((bVar3) &&
       (pQVar5 = QFileInfoGatherer::iconProvider
                           ((QFileInfoGatherer *)
                            (this_00->fileInfoGatherer)._M_t.
                            super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                            .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl),
       pQVar5 != (QAbstractFileIconProvider *)0x0)) {
      this_01 = QFileSystemModelPrivate::node(this_00,index);
      bVar3 = QFileSystemModelPrivate::QFileSystemNode::isDir(this_01);
      (*pQVar5->_vptr_QAbstractFileIconProvider[2])(&QStack_58,pQVar5,(ulong)(6 - bVar3));
      QIcon::operator=(&icon,&QStack_58);
      QIcon::~QIcon(&QStack_58);
    }
    QIcon::operator_cast_to_QVariant(__return_storage_ptr__,&icon);
    QIcon::~QIcon(&icon);
    goto LAB_0056eec5;
  case 2:
    iVar1 = index->c;
    if (iVar1 != 0) goto LAB_0056ee15;
switchD_0056ed98_caseD_102:
    QFileSystemModelPrivate::name((QString *)&icon,this_00,index);
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    goto switchD_0056ed98_caseD_fd;
  case 7:
    if (index->c == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        ::QVariant::QVariant(__return_storage_ptr__,0x82);
        return __return_storage_ptr__;
      }
      goto LAB_0056f004;
    }
    goto switchD_0056ed98_caseD_fd;
  default:
    switch(role) {
    case 0xfc:
      fileInfo((QFileSystemModel *)&icon,(QModelIndex *)this);
      ::QVariant::fromValue<QFileInfo,_true>(__return_storage_ptr__,(QFileInfo *)&icon);
      QFileInfo::~QFileInfo((QFileInfo *)&icon);
      goto LAB_0056eec5;
    default:
      goto switchD_0056ed98_caseD_fd;
    case 0x101:
      filePath((QString *)&icon,this,index);
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)&icon);
      break;
    case 0x102:
      goto switchD_0056ed98_caseD_102;
    case 0x103:
      PVar4 = permissions(this,index);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        ::QVariant::QVariant
                  (__return_storage_ptr__,
                   (int)PVar4.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                        super_QFlagsStorage<QFileDevice::Permission>.i);
        return __return_storage_ptr__;
      }
      goto LAB_0056f004;
    }
    goto LAB_0056eec0;
  }
  ::QVariant::QVariant(__return_storage_ptr__,(QString *)&icon);
LAB_0056eec0:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&icon);
LAB_0056eec5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
LAB_0056f004:
  __stack_chk_fail();
switchD_0056ed98_caseD_fd:
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  goto LAB_0056eec5;
}

Assistant:

QVariant QFileSystemModel::data(const QModelIndex &index, int role) const
{
    Q_D(const QFileSystemModel);
    if (!index.isValid() || index.model() != this)
        return QVariant();

    switch (role) {
    case Qt::EditRole:
        if (index.column() == QFileSystemModelPrivate::NameColumn)
            return d->name(index);
        Q_FALLTHROUGH();
    case Qt::DisplayRole:
        switch (index.column()) {
        case QFileSystemModelPrivate::NameColumn: return d->displayName(index);
        case QFileSystemModelPrivate::SizeColumn: return d->size(index);
        case QFileSystemModelPrivate::TypeColumn: return d->type(index);
        case QFileSystemModelPrivate::TimeColumn: return d->time(index);
        default:
            qWarning("data: invalid display value column %d", index.column());
            break;
        }
        break;
    case FilePathRole:
        return filePath(index);
    case FileNameRole:
        return d->name(index);
    case FileInfoRole:
        return QVariant::fromValue(fileInfo(index));
    case Qt::DecorationRole:
        if (index.column() == QFileSystemModelPrivate::NameColumn) {
            QIcon icon = d->icon(index);
#if QT_CONFIG(filesystemwatcher)
            if (icon.isNull()) {
                using P = QAbstractFileIconProvider;
                if (auto *provider = d->fileInfoGatherer->iconProvider())
                    icon = provider->icon(d->node(index)->isDir() ? P::Folder: P::File);
            }
#endif // filesystemwatcher
            return icon;
        }
        break;
    case Qt::TextAlignmentRole:
        if (index.column() == QFileSystemModelPrivate::SizeColumn)
            return QVariant(Qt::AlignTrailing | Qt::AlignVCenter);
        break;
    case FilePermissions:
        int p = permissions(index);
        return p;
    }

    return QVariant();
}